

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

SRes crnlib::LzmaEnc_SetProps(CLzmaEncHandle pp,CLzmaEncProps *props2)

{
  void *in_RSI;
  long in_RDI;
  UInt32 numHashBytes;
  uint fb;
  CLzmaEncProps props;
  CLzmaEnc *p;
  int local_58;
  uint local_54;
  CLzmaEncProps local_50;
  long local_20;
  SRes local_4;
  
  local_20 = in_RDI;
  memcpy(&local_50,in_RSI,0x30);
  LzmaEncProps_Normalize(&local_50);
  if ((((local_50.lc < 9) && (local_50.lp < 5)) && (local_50.pb < 5)) &&
     ((local_50.dictSize < 0x80000001 && (local_50.dictSize < 0x40000001)))) {
    *(UInt32 *)(local_20 + 0x3d350) = local_50.dictSize;
    *(UInt32 *)(local_20 + 0x3d354) = local_50.mc;
    local_54 = local_50.fb;
    if ((uint)local_50.fb < 5) {
      local_54 = 5;
    }
    if (0x111 < local_54) {
      local_54 = 0x111;
    }
    *(uint *)(local_20 + 0x32f68) = local_54;
    *(int *)(local_20 + 0x33bcc) = local_50.lc;
    *(int *)(local_20 + 0x33bd0) = local_50.lp;
    *(int *)(local_20 + 0x33bd4) = local_50.pb;
    *(uint *)(local_20 + 0x3d2e0) = (uint)(local_50.algo == 0);
    *(int *)(local_20 + 0xa0) = local_50.btMode;
    local_58 = 4;
    if (local_50.btMode != 0) {
      if (local_50.numHashBytes < 2) {
        local_58 = 2;
      }
      else if (local_50.numHashBytes < 4) {
        local_58 = local_50.numHashBytes;
      }
    }
    *(int *)(local_20 + 0x98) = local_58;
    *(UInt32 *)(local_20 + 0x74) = local_50.mc;
    *(uint *)(local_20 + 0x3d330) = local_50.writeEndMark;
    local_4 = 0;
  }
  else {
    local_4 = 5;
  }
  return local_4;
}

Assistant:

SRes LzmaEnc_SetProps(CLzmaEncHandle pp, const CLzmaEncProps* props2) {
  CLzmaEnc* p = (CLzmaEnc*)pp;
  CLzmaEncProps props = *props2;
  LzmaEncProps_Normalize(&props);

  if (props.lc > LZMA_LC_MAX ||
      props.lp > LZMA_LP_MAX ||
      props.pb > LZMA_PB_MAX ||
      props.dictSize > (1U << kDicLogSizeMaxCompress) ||
      props.dictSize > (1 << 30))
    return SZ_ERROR_PARAM;
  p->dictSize = props.dictSize;
  p->matchFinderCycles = props.mc;
  {
    unsigned fb = props.fb;
    if (fb < 5)
      fb = 5;
    if (fb > LZMA_MATCH_LEN_MAX)
      fb = LZMA_MATCH_LEN_MAX;
    p->numFastBytes = fb;
  }
  p->lc = props.lc;
  p->lp = props.lp;
  p->pb = props.pb;
  p->fastMode = (props.algo == 0);
  p->matchFinderBase.btMode = props.btMode;
  {
    UInt32 numHashBytes = 4;
    if (props.btMode) {
      if (props.numHashBytes < 2)
        numHashBytes = 2;
      else if (props.numHashBytes < 4)
        numHashBytes = props.numHashBytes;
    }
    p->matchFinderBase.numHashBytes = numHashBytes;
  }

  p->matchFinderBase.cutValue = props.mc;

  p->writeEndMark = props.writeEndMark;

#ifdef COMPRESS_MF_MT
  /*
  if (newMultiThread != _multiThread)
  {
    ReleaseMatchFinder();
    _multiThread = newMultiThread;
  }
  */
  p->multiThread = (props.numThreads > 1);
#endif

  return SZ_OK;
}